

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_alt.cc
# Opt level: O0

void * v2i_issuer_alt(X509V3_EXT_METHOD *method,X509V3_CTX *ctx,stack_st_CONF_VALUE *nval)

{
  int iVar1;
  CONF_VALUE *pCVar2;
  GENERAL_NAME *a;
  size_t sVar3;
  GENERAL_NAME *gen;
  CONF_VALUE *cnf;
  size_t i;
  GENERAL_NAMES *gens;
  stack_st_CONF_VALUE *nval_local;
  X509V3_CTX *ctx_local;
  X509V3_EXT_METHOD *method_local;
  
  method_local = (X509V3_EXT_METHOD *)sk_GENERAL_NAME_new_null();
  if (method_local == (X509V3_EXT_METHOD *)0x0) {
    method_local = (X509V3_EXT_METHOD *)0x0;
  }
  else {
    for (cnf = (CONF_VALUE *)0x0; pCVar2 = (CONF_VALUE *)sk_CONF_VALUE_num(nval), cnf < pCVar2;
        cnf = (CONF_VALUE *)((long)&cnf->section + 1)) {
      pCVar2 = sk_CONF_VALUE_value(nval,(size_t)cnf);
      iVar1 = x509v3_conf_name_matches(pCVar2->name,"issuer");
      if (((iVar1 == 0) || (pCVar2->value == (char *)0x0)) ||
         (iVar1 = strcmp(pCVar2->value,"copy"), iVar1 != 0)) {
        a = v2i_GENERAL_NAME((X509V3_EXT_METHOD *)method,(X509V3_CTX *)ctx,(CONF_VALUE *)pCVar2);
        if ((a == (GENERAL_NAME *)0x0) ||
           (sVar3 = sk_GENERAL_NAME_push((stack_st_GENERAL_NAME *)method_local,(GENERAL_NAME *)a),
           sVar3 == 0)) {
          GENERAL_NAME_free(a);
          goto LAB_0031f177;
        }
      }
      else {
        iVar1 = copy_issuer(ctx,(GENERAL_NAMES *)method_local);
        if (iVar1 == 0) {
LAB_0031f177:
          sk_GENERAL_NAME_pop_free((stack_st_GENERAL_NAME *)method_local,GENERAL_NAME_free);
          return (void *)0x0;
        }
      }
    }
  }
  return method_local;
}

Assistant:

static void *v2i_issuer_alt(const X509V3_EXT_METHOD *method,
                            const X509V3_CTX *ctx,
                            const STACK_OF(CONF_VALUE) *nval) {
  GENERAL_NAMES *gens = sk_GENERAL_NAME_new_null();
  if (gens == NULL) {
    return NULL;
  }
  for (size_t i = 0; i < sk_CONF_VALUE_num(nval); i++) {
    const CONF_VALUE *cnf = sk_CONF_VALUE_value(nval, i);
    if (x509v3_conf_name_matches(cnf->name, "issuer") && cnf->value &&
        !strcmp(cnf->value, "copy")) {
      if (!copy_issuer(ctx, gens)) {
        goto err;
      }
    } else {
      GENERAL_NAME *gen = v2i_GENERAL_NAME(method, ctx, cnf);
      if (gen == NULL || !sk_GENERAL_NAME_push(gens, gen)) {
        GENERAL_NAME_free(gen);
        goto err;
      }
    }
  }
  return gens;
err:
  sk_GENERAL_NAME_pop_free(gens, GENERAL_NAME_free);
  return NULL;
}